

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_tIME(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  png_time local_2c;
  png_time mod_time;
  png_byte buf [7];
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if ((png_ptr->mode & 1) != 0) {
    if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x200) == 0)) {
      if ((png_ptr->mode & 4) != 0) {
        png_ptr->mode = png_ptr->mode | 8;
      }
      if (length == 7) {
        png_crc_read(png_ptr,(png_bytep)((long)&mod_time.year + 1),7);
        iVar1 = png_crc_finish(png_ptr,0);
        if (iVar1 == 0) {
          local_2c.second = mod_time._7_1_;
          local_2c.minute = mod_time.second;
          local_2c.hour = mod_time.minute;
          local_2c.day = mod_time.hour;
          local_2c.month = mod_time.day;
          local_2c.year = (ushort)mod_time.year._1_1_ * 0x100 + (ushort)mod_time.month;
          png_set_tIME(png_ptr,info_ptr,&local_2c);
        }
      }
      else {
        png_crc_finish(png_ptr,length);
        png_chunk_benign_error(png_ptr,"invalid");
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"duplicate");
    }
    return;
  }
  png_chunk_error(png_ptr,"missing IHDR");
}

Assistant:

void /* PRIVATE */
png_handle_tIME(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[7];
   png_time mod_time;

   png_debug(1, "in png_handle_tIME");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_tIME) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      png_ptr->mode |= PNG_AFTER_IDAT;

   if (length != 7)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, 7);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   mod_time.second = buf[6];
   mod_time.minute = buf[5];
   mod_time.hour = buf[4];
   mod_time.day = buf[3];
   mod_time.month = buf[2];
   mod_time.year = png_get_uint_16(buf);

   png_set_tIME(png_ptr, info_ptr, &mod_time);
}